

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-xtra.h
# Opt level: O1

Expression
dither(ComputationGraph *cg,Expression *expr,float pad_value,
      vector<float,_std::allocator<float>_> *aux_mem)

{
  long lVar1;
  pointer pfVar2;
  uint uVar3;
  ComputationGraph *pCVar4;
  vector<float,_std::allocator<float>_> *in_RCX;
  undefined8 extraout_RDX;
  uint v;
  undefined4 uVar6;
  Expression EVar7;
  initializer_list<dynet::expr::Expression> __l;
  initializer_list<dynet::expr::Expression> __l_00;
  Expression left_shift;
  Expression padded;
  Expression right_shift;
  allocator_type local_bd;
  float local_bc;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_b8;
  ComputationGraph *local_a0;
  undefined1 local_94 [4];
  Expression local_90;
  detail local_80 [16];
  Expression local_70;
  Expression local_60;
  pointer local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 uStack_40;
  uint local_38;
  undefined8 uVar5;
  
  lVar1 = *(long *)(expr->pg +
                   (ulong)*(uint *)&(aux_mem->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_finish * 8);
  pfVar2 = (in_RCX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((in_RCX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar2) {
    (in_RCX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar2;
  }
  uVar6 = 1;
  uVar3 = *(uint *)(lVar1 + 0x24);
  if (*(uint *)(lVar1 + 0x3c) < 2) {
    uVar3 = 1;
  }
  local_bc = pad_value;
  local_a0 = cg;
  std::vector<float,_std::allocator<float>_>::resize(in_RCX,(ulong)uVar3,&local_bc);
  if (1 < *(uint *)(lVar1 + 0x3c)) {
    uVar6 = *(undefined4 *)(lVar1 + 0x24);
  }
  local_44 = 1;
  uStack_40._0_4_ = 1;
  local_60.pg = (ComputationGraph *)CONCAT44(local_60.pg._4_4_,uVar6);
  dynet::ComputationGraph::add_input((Dim *)local_94,(vector *)expr);
  local_60.i.t = (uint)local_94;
  local_50 = (aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = *(undefined4 *)
              &(aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  local_38 = (uint)local_94;
  __l._M_len = 3;
  __l._M_array = &local_60;
  local_60.pg = (ComputationGraph *)expr;
  uStack_40 = expr;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            (&local_b8,__l,(allocator_type *)&local_90);
  dynet::expr::detail::
  f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            (local_80,&local_b8);
  if (local_b8.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  dynet::expr::pickrange(&local_90,(uint)local_80,2);
  dynet::expr::pickrange(&local_70,(uint)local_80,0);
  local_60.pg = local_90.pg;
  local_60.i.t = local_90.i.t;
  local_50 = (aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = *(undefined4 *)
              &(aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  uStack_40._0_4_ = SUB84(local_70.pg,0);
  uStack_40._4_4_ = (undefined4)((ulong)local_70.pg >> 0x20);
  local_38 = local_70.i.t;
  __l_00._M_len = 3;
  __l_00._M_array = &local_60;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            (&local_b8,__l_00,&local_bd);
  pCVar4 = local_a0;
  EVar7 = dynet::expr::detail::
          f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                    ((detail *)local_a0,&local_b8);
  uVar5 = EVar7._8_8_;
  if (local_b8.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar5 = extraout_RDX;
  }
  EVar7._8_8_ = uVar5;
  EVar7.pg = pCVar4;
  return EVar7;
}

Assistant:

Expression dither(ComputationGraph &cg, const Expression &expr, float pad_value, std::vector<float> *aux_mem)
{
    const auto& shape = cg.nodes[expr.i]->dim;
    aux_mem->clear();
    aux_mem->resize(shape.cols(), pad_value);
    Expression padding(&cg, cg.add_input(Dim({shape.cols()}), aux_mem));
    Expression padded = concatenate(std::vector<Expression>({padding, expr, padding}));
    Expression left_shift = pickrange(padded, 2, shape.rows()+2);
    Expression right_shift = pickrange(padded, 0, shape.rows());
    return concatenate_cols(std::vector<Expression>({left_shift, expr, right_shift}));
}